

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall Net::send_with_retry(Net *this,string *request)

{
  BIO *b;
  int iVar1;
  void *data;
  ostream *this_00;
  string *request_local;
  Net *this_local;
  
  do {
    b = (BIO *)this->sock;
    data = (void *)std::__cxx11::string::c_str();
    iVar1 = std::__cxx11::string::size();
    iVar1 = BIO_write(b,data,iVar1 + 1);
    if (0 < iVar1) {
      return;
    }
    iVar1 = BIO_test_flags((BIO *)this->sock,8);
  } while (iVar1 != 0);
  this_00 = std::operator<<((ostream *)&std::cout,"send error");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this->closed = 1;
  return;
}

Assistant:

void Net::send_with_retry(std::string request){
	while(BIO_write(sock,request.c_str(),request.size()+1)<=0){
		if(!BIO_should_retry(sock)){
			std::cout<<"send error"<<std::endl;
			closed=1;
			return;
		}
	}
}